

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

Node * CleanNode(TidyDocImpl *doc,Node *node)

{
  TidyTriState state;
  TidyTriState state_00;
  TidyTagId TVar1;
  Node *node_00;
  Node *pNVar2;
  AttVal *av;
  AttVal **ppAVar3;
  Bool BVar4;
  uint uVar5;
  uint uVar6;
  AttVal *pAVar7;
  Dict *pDVar8;
  tmbstr ptVar9;
  AttVal *pAVar10;
  long lVar11;
  char *pcVar12;
  Node **in_R8;
  Node *pNVar13;
  tmbchar buf [256];
  tmbchar local_138 [12];
  char acStack_12c [252];
  
  state = *(TidyTriState *)((doc->config).value + 0x32);
  state_00 = *(TidyTriState *)((doc->config).value + 0x34);
  BVar4 = prvTidynodeIsElement(node);
  if (BVar4 == no) {
    return node;
  }
LAB_0014e0dc:
  if (node == (Node *)0x0) goto LAB_0014e17a;
  if (((node->tag != (Dict *)0x0) &&
      (((((TVar1 = node->tag->id, TVar1 == TidyTag_DIR || (TVar1 == TidyTag_UL)) ||
         (TVar1 == TidyTag_OL)) &&
        ((pNVar13 = node->content, pNVar13 != (Node *)0x0 && (pNVar13->next == (Node *)0x0)))) &&
       (pNVar13->tag != (Dict *)0x0)))) &&
     ((pNVar13->tag->id == TidyTag_LI && (pNVar13->implicit != no)))) {
    pDVar8 = prvTidyLookupTagDef(TidyTag_DIV);
    node->tag = pDVar8;
    (*doc->allocator->vtbl->free)(doc->allocator,node->element);
    ptVar9 = prvTidytmbstrdup(doc->allocator,"div");
    node->element = ptVar9;
    pcVar12 = "margin-left: 2em";
    goto LAB_0014e593;
  }
  if (node == (Node *)0x0) {
LAB_0014e17a:
    BVar4 = MergeNestedElements(doc,TidyTag_DIV,state,node,in_R8);
    if ((BVar4 != no) ||
       (BVar4 = MergeNestedElements(doc,TidyTag_SPAN,state_00,node,in_R8), BVar4 != no))
    goto LAB_0014e5a3;
    if (((node != (Node *)0x0) &&
        (((node->tag != (Dict *)0x0 && (uVar5 = node->tag->id - TidyTag_TABLE, uVar5 < 9)) &&
         ((0x125U >> (uVar5 & 0x1f) & 1) != 0)))) &&
       (pAVar7 = prvTidyAttrGetById(node,TidyAttr_BGCOLOR), pAVar7 != (AttVal *)0x0)) {
      prvTidytmbsnprintf(local_138,0x100,"background-color: %s");
      prvTidyRemoveAttribute(doc,node,pAVar7);
      prvTidyAddStyleProperty(doc,node,local_138);
    }
    BVar4 = CanApplyBlockStyle(node);
    if (BVar4 != no) {
      if ((((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
          (node->tag->id != TidyTag_CAPTION)) &&
         (pAVar7 = node->attributes, pAVar7 != (AttVal *)0x0)) {
        pAVar10 = (AttVal *)0x0;
        do {
          if ((pAVar7->dict != (Attribute *)0x0) && (pAVar7->dict->id == TidyAttr_ALIGN)) {
            if (pAVar10 == (AttVal *)0x0) {
              pAVar10 = (AttVal *)&node->attributes;
            }
            pAVar10->next = pAVar7->next;
            ptVar9 = pAVar7->value;
            if (ptVar9 == (tmbstr)0x0) goto LAB_0014e37d;
            prvTidytmbstrcpy(local_138,"text-align: ");
            lVar11 = 0xc;
            goto LAB_0014e344;
          }
          ppAVar3 = &pAVar7->next;
          pAVar10 = pAVar7;
          pAVar7 = *ppAVar3;
        } while (*ppAVar3 != (AttVal *)0x0);
      }
      goto LAB_0014e388;
    }
    goto LAB_0014e39c;
  }
  pDVar8 = node->tag;
  if ((pDVar8 != (Dict *)0x0) &&
     ((((pDVar8->id == TidyTag_UL || ((pDVar8 != (Dict *)0x0 && (pDVar8->id == TidyTag_OL)))) &&
       (pNVar13 = node->content, pNVar13 != (Node *)0x0)) &&
      ((((pNVar13->next == (Node *)0x0 && (node_00 = pNVar13->content, node_00 != (Node *)0x0)) &&
        (node_00->tag == pDVar8)) && (node_00->next == (Node *)0x0)))))) {
    node_00->prev = node->prev;
    node_00->next = node->next;
    node_00->parent = node->parent;
    prvTidyFixNodeLinks(node_00);
    pNVar13->content = (Node *)0x0;
    prvTidyFreeNode(doc,pNVar13);
    node->next = (Node *)0x0;
    node->content = (Node *)0x0;
    prvTidyFreeNode(doc,node);
    pNVar13 = node_00->prev;
    if (pNVar13 == (Node *)0x0) {
      return node_00;
    }
    pDVar8 = pNVar13->tag;
    if (pDVar8 == (Dict *)0x0) {
      return node_00;
    }
    if (pDVar8->id != TidyTag_UL) {
      if (pDVar8 == (Dict *)0x0) {
        return node_00;
      }
      if (pDVar8->id != TidyTag_OL) {
        return node_00;
      }
    }
    pNVar2 = pNVar13->last;
    if (pNVar2 == (Node *)0x0) {
      return node_00;
    }
    pNVar13->next = node_00->next;
    prvTidyFixNodeLinks(pNVar13);
    node_00->parent = pNVar2;
    node_00->next = (Node *)0x0;
    node_00->prev = pNVar2->last;
    prvTidyFixNodeLinks(node_00);
    CleanNode(doc,node_00);
    return node_00;
  }
  if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_CENTER))
  goto LAB_0014e17a;
  RenameElem(doc,node,TidyTag_DIV);
  pcVar12 = "text-align: center";
LAB_0014e4b5:
  prvTidyAddStyleProperty(doc,node,pcVar12);
  goto LAB_0014e5a3;
  while (lVar11 = lVar11 + 1, lVar11 != 0x7f) {
LAB_0014e344:
    uVar6 = prvTidyToLower((int)ptVar9[lVar11 + -0xc]);
    local_138[lVar11] = (char)uVar6;
    if ((char)uVar6 == '\0') goto LAB_0014e365;
  }
  lVar11 = 0x7f;
LAB_0014e365:
  local_138[lVar11] = '\0';
  prvTidyAddStyleProperty(doc,node,local_138);
LAB_0014e37d:
  prvTidyFreeAttribute(doc,pAVar7);
LAB_0014e388:
  pNVar13 = node->content;
  if ((pNVar13 == (Node *)0x0) || (pNVar13->next != (Node *)0x0)) {
LAB_0014e39c:
    BVar4 = CanApplyInlineStyle(node);
    if ((BVar4 != no) &&
       ((pNVar13 = node->content, pNVar13 != (Node *)0x0 && (pNVar13->next == (Node *)0x0)))) {
      pDVar8 = pNVar13->tag;
      lVar11 = 0;
      pcVar12 = "font-weight: bold";
      do {
        if ((pDVar8 != (Dict *)0x0) && (pDVar8->id == *(TidyTagId *)((long)&DAT_001d2e10 + lVar11)))
        goto LAB_0014e57c;
        pcVar12 = *(char **)((long)&PTR_anon_var_dwarf_438b2_001d2e30 + lVar11);
        lVar11 = lVar11 + 0x18;
      } while (lVar11 != 0x78);
      if ((pDVar8 != (Dict *)0x0) && (pDVar8->id == TidyTag_FONT)) goto LAB_0014e53b;
    }
    if (((node->parent->content != node) || (node->next != (Node *)0x0)) ||
       ((BVar4 = CanApplyBlockStyle(node->parent), BVar4 == no &&
        (BVar4 = CanApplyInlineStyle(node->parent), BVar4 == no)))) {
      lVar11 = 0;
      pcVar12 = "font-weight: bold";
      do {
        if (((*(int *)((long)&DAT_001d2e20 + lVar11) != 0) && (node->tag != (Dict *)0x0)) &&
           (node->tag->id == *(TidyTagId *)((long)&DAT_001d2e10 + lVar11))) {
          RenameElem(doc,node,TidyTag_SPAN);
          goto LAB_0014e4b5;
        }
        pcVar12 = *(char **)((long)&PTR_anon_var_dwarf_438b2_001d2e30 + lVar11);
        lVar11 = lVar11 + 0x18;
      } while (lVar11 != 0x78);
    }
    if (node->tag == (Dict *)0x0) {
      return node;
    }
    if (node->tag->id != TidyTag_FONT) {
      return node;
    }
    if (((node->parent->content == node) && (node->next == (Node *)0x0)) &&
       (BVar4 = CanApplyBlockStyle(node->parent), BVar4 != no)) {
      return node;
    }
    AddFontStyles(doc,node,node->attributes);
    pAVar7 = node->attributes;
    pAVar10 = (AttVal *)0x0;
    while (av = pAVar7, av != (AttVal *)0x0) {
      pAVar7 = av->next;
      if ((av->dict == (Attribute *)0x0) || (av->dict->id != TidyAttr_STYLE)) {
        prvTidyFreeAttribute(doc,av);
      }
      else {
        av->next = (AttVal *)0x0;
        pAVar10 = av;
      }
    }
    node->attributes = pAVar10;
    RenameElem(doc,node,TidyTag_SPAN);
    goto LAB_0014e5a3;
  }
  pDVar8 = pNVar13->tag;
  lVar11 = 0;
  pcVar12 = "font-weight: bold";
  do {
    if ((pDVar8 != (Dict *)0x0) && (pDVar8->id == *(TidyTagId *)((long)&DAT_001d2e10 + lVar11)))
    goto LAB_0014e57c;
    pcVar12 = *(char **)((long)&PTR_anon_var_dwarf_438b2_001d2e30 + lVar11);
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x78);
  if ((pDVar8 == (Dict *)0x0) || (pDVar8->id != TidyTag_FONT)) goto LAB_0014e39c;
LAB_0014e53b:
  MergeStyles(doc,node,pNVar13);
  AddFontStyles(doc,node,pNVar13->attributes);
  goto LAB_0014e598;
LAB_0014e57c:
  MergeStyles(doc,node,pNVar13);
LAB_0014e593:
  prvTidyAddStyleProperty(doc,node,pcVar12);
LAB_0014e598:
  StripOnlyChild(doc,node);
LAB_0014e5a3:
  BVar4 = prvTidynodeIsElement(node);
  if (BVar4 == no) {
    return node;
  }
  goto LAB_0014e0dc;
}

Assistant:

Node* CleanNode( TidyDocImpl* doc, Node *node )
{
    Node *next = NULL;
    TidyTriState mergeDivs = cfgAutoBool(doc, TidyMergeDivs);
    TidyTriState mergeSpans = cfgAutoBool(doc, TidyMergeSpans);

    for (next = node; TY_(nodeIsElement)(node); node = next)
    {
        if ( Dir2Div(doc, node, &next) )
            continue;

        /* Special case: true result means
        ** that arg node and its parent no longer exist.
        ** So we must jump back up the CreateStyleProperties()
        ** call stack until we have a valid node reference.
        */
        if ( NestedList(doc, node, &next) )
            return next;

        if ( Center2Div(doc, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_DIV, mergeDivs, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_SPAN, mergeSpans, node, &next) )
            continue;

        if ( BlockStyle(doc, node, &next) )
            continue;

        if ( InlineStyle(doc, node, &next) )
            continue;

        if ( InlineElementToCSS(doc, node, &next) )
            continue;

        if ( Font2Span(doc, node, &next) )
            continue;

        break;
    }

    return next;
}